

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

int genPiecesRecusively(piecefunc_t *gen,PieceEnv *env,Piece *current,int depth)

{
  uint uVar1;
  uint *puVar2;
  Piece *pPVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  PieceEnv *pPVar7;
  PieceEnv *pPVar8;
  long lVar9;
  int n_local;
  PieceEnv env_local;
  int local_94;
  PieceEnv local_90;
  
  iVar4 = 0;
  if (depth < 9) {
    local_94 = 0;
    pPVar7 = env;
    pPVar8 = &local_90;
    for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
      pPVar8->list = pPVar7->list;
      pPVar7 = (PieceEnv *)&pPVar7->n;
      pPVar8 = (PieceEnv *)&pPVar8->n;
    }
    local_90.list = env->list + *env->n;
    local_90.n = &local_94;
    iVar4 = (*gen)(&local_90,current,depth);
    if (iVar4 == 0) {
LAB_0010fb68:
      iVar4 = 0;
    }
    else {
      uVar5 = *env->rng * 0x5deece66d + 0xb;
      *env->rng = uVar5 & 0xffffffffffff;
      puVar2 = (uint *)env->n;
      uVar1 = *puVar2;
      if (0 < (long)local_94) {
        lVar6 = 0;
        do {
          local_90.list[lVar6].depth = (int8_t)(uVar5 >> 0x10);
          if (0 < (int)uVar1) {
            pPVar3 = env->list;
            lVar9 = 0;
            do {
              if ((((local_90.list[lVar6].bb0.x <= *(int *)((long)&(pPVar3->bb1).x + lVar9)) &&
                   (*(int *)((long)&(pPVar3->bb0).x + lVar9) <= local_90.list[lVar6].bb1.x)) &&
                  (local_90.list[lVar6].bb0.z <= *(int *)((long)&(pPVar3->bb1).z + lVar9))) &&
                 (((*(int *)((long)&(pPVar3->bb0).z + lVar9) <= local_90.list[lVar6].bb1.z &&
                   (local_90.list[lVar6].bb0.y <= *(int *)((long)&(pPVar3->bb1).y + lVar9))) &&
                  (*(int *)((long)&(pPVar3->bb0).y + lVar9) <= local_90.list[lVar6].bb1.y)))) {
                if (current->depth != (&pPVar3->depth)[lVar9]) goto LAB_0010fb68;
                break;
              }
              lVar9 = lVar9 + 0x38;
            } while ((ulong)uVar1 * 0x38 - lVar9 != 0);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != local_94);
      }
      *puVar2 = local_94 + uVar1;
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

static
int genPiecesRecusively(piecefunc_t gen, PieceEnv *env, Piece *current, int depth)
{
    if (depth > 8)
        return 0;
    int i, j, n_local = 0;
    PieceEnv env_local = *env;
    env_local.list = env->list + *env->n;
    env_local.n = &n_local;
    if (!gen(&env_local, current, depth))
        return 0;
    int gendepth = next(env->rng, 32);
    for (i = 0; i < n_local; i++)
    {
        Piece *p = env_local.list + i;
        p->depth = gendepth;
        for (j = 0; j < *env->n; j++)
        {   // check for piece with bounding box collition
            Piece *q = env->list + j;
            if (q->bb1.x >= p->bb0.x && q->bb0.x <= p->bb1.x &&
                q->bb1.z >= p->bb0.z && q->bb0.z <= p->bb1.z &&
                q->bb1.y >= p->bb0.y && q->bb0.y <= p->bb1.y)
            {
                if (current->depth != q->depth)
                    return 0;
                break;
            }
        }
    }
    (*env->n) += n_local;
    return 1;
}